

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O1

istream * operator>>(istream *s,Circuit *C)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  runtime_error *this_01;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  GateType GVar11;
  bool bVar12;
  uint in;
  uint out;
  uint nG;
  string ss;
  uint te;
  uint local_8c;
  uint local_84;
  uint local_74;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  uint local_4c;
  Circuit *local_48;
  vector<GateType,_std::allocator<GateType>_> *local_40;
  ulong local_38;
  
  piVar5 = std::istream::_M_extract<unsigned_int>((uint *)s);
  std::istream::_M_extract<unsigned_int>((uint *)piVar5);
  local_40 = &C->GateT;
  std::vector<GateType,_std::allocator<GateType>_>::resize(local_40,(ulong)local_74);
  this = &C->GateI;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(this,(ulong)local_74);
  this_00 = &C->GateO;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(this_00,(ulong)local_74);
  std::istream::_M_extract<unsigned_int>((uint *)s);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&C->numI,(ulong)local_4c);
  if ((C->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (C->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 1;
    do {
      std::istream::_M_extract<unsigned_int>((uint *)s);
      bVar1 = uVar9 < (ulong)((long)(C->numI).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(C->numI).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2);
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar1);
  }
  std::istream::_M_extract<unsigned_int>((uint *)s);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&C->numO,(ulong)local_4c);
  if ((C->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (C->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 1;
    do {
      std::istream::_M_extract<unsigned_int>((uint *)s);
      bVar1 = uVar9 < (ulong)((long)(C->numO).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(C->numO).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2);
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar1);
  }
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (local_74 != 0) {
    uVar9 = 0;
    local_48 = C;
    do {
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)s);
      std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      uVar8 = local_8c;
      if ((int)local_8c < 3) {
        uVar8 = 2;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((this->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar9,(ulong)uVar8);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((this_00->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar9,(ulong)local_84);
      local_38 = uVar9;
      if (local_8c != 0) {
        uVar10 = 0;
        do {
          std::istream::_M_extract<unsigned_int>((uint *)s);
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_8c);
      }
      if (local_84 != 0) {
        uVar10 = 0;
        do {
          std::istream::_M_extract<unsigned_int>((uint *)s);
          uVar10 = uVar10 + 1;
        } while (uVar10 < local_84);
      }
      std::operator>>(s,(string *)&local_70);
      uVar10 = local_38;
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      GVar11 = XOR;
      if (iVar3 == 0) {
        GVar11 = AND;
        bVar2 = 1;
        bVar7 = 0;
        bVar6 = 0;
        bVar1 = false;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar4 == 0) {
          bVar7 = 0;
          bVar6 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_70);
          if (iVar4 == 0) {
            GVar11 = INV;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_70);
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::string::compare((char *)&local_70);
              if (iVar4 != 0) {
                iVar4 = std::__cxx11::string::compare((char *)&local_70);
                if (iVar4 != 0) {
                  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_01,"Circuit error");
                  goto LAB_0010448d;
                }
                GVar11 = MAND;
                bVar1 = true;
                bVar7 = 0;
                bVar6 = 0;
                bVar2 = 0;
                goto LAB_00104347;
              }
              GVar11 = EQW;
              bVar7 = 1;
              bVar6 = 0;
              goto LAB_0010433b;
            }
            GVar11 = EQ;
          }
          bVar7 = 0;
          bVar6 = 0;
        }
LAB_0010433b:
        bVar2 = 1;
        bVar1 = false;
      }
LAB_00104347:
      (local_40->super__Vector_base<GateType,_std::allocator<GateType>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar9] = GVar11;
      if ((GVar11 & ~AND) == INV) {
        bVar12 = local_8c == 1;
      }
      else {
        bVar12 = !(bool)(bVar7 & local_8c != 1);
      }
      if (!bVar12) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Circuit error");
        goto LAB_0010448d;
      }
      if (iVar3 == 0) {
        if (local_8c != 2) goto LAB_00104435;
      }
      else if ((bool)(bVar6 & local_8c != 2)) {
LAB_00104435:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Circuit error");
        goto LAB_0010448d;
      }
      if ((bool)(bVar2 & local_84 != 1)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Circuit error");
LAB_0010448d:
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((bVar1) && (local_84 != local_8c >> 1)) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Circuit error");
        goto LAB_0010448d;
      }
      uVar8 = (int)uVar10 + 1;
      uVar9 = (ulong)uVar8;
      C = local_48;
    } while (uVar8 < local_74);
  }
  Circuit::recompute_map(C);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return s;
}

Assistant:

istream &operator>>(istream &s, Circuit &C) {
  unsigned int nG, te;
  s >> nG >> C.nWires;

  C.GateT.resize(nG);
  C.GateI.resize(nG);
  C.GateO.resize(nG);

  s >> te;
  C.numI.resize(te);
  for (unsigned int i = 0; i < C.numI.size(); i++) {
    s >> C.numI[i];
  }

  s >> te;
  C.numO.resize(te);
  for (unsigned int i = 0; i < C.numO.size(); i++) {
    s >> C.numO[i];
  }

  unsigned int in, out;
  string ss;
  for (unsigned int i = 0; i < nG; i++) {
    s >> in >> out;
    C.GateI[i].resize(max(2, (int)in));
    C.GateO[i].resize(out);
    for (unsigned int j = 0; j < in; j++) {
      s >> C.GateI[i][j];
    }
    for (unsigned int j = 0; j < out; j++) {
      s >> C.GateO[i][j];
    }
    s >> ss;
    if (ss.compare("AND") == 0) {
      C.GateT[i] = AND;
    } else if (ss.compare("XOR") == 0) {
      C.GateT[i] = XOR;
    } else if (ss.compare("INV") == 0) {
      C.GateT[i] = INV;
    } else if (ss.compare("EQ") == 0) {
      C.GateT[i] = EQ;
    } else if (ss.compare("EQW") == 0) {
      C.GateT[i] = EQW;
    } else if (ss.compare("MAND") == 0) {
      C.GateT[i] = MAND;
    } else {
      throw std::runtime_error("Circuit error");
    }

    // Check dimensions of in and out are all OK
    if ((C.GateT[i] == INV || C.GateT[i] == EQ || C.GateT[i] == EQW) &&
        in != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == AND || C.GateT[i] == XOR) && in != 2) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] != MAND) && out != 1) {
      throw std::runtime_error("Circuit error");
    }
    if ((C.GateT[i] == MAND) && out != in / 2) {
      throw std::runtime_error("Circuit error");
    }
  }

  C.recompute_map();

  return s;
}